

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_2c4f4c::TfFinder::~TfFinder(TfFinder *this)

{
  ~TfFinder(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

~TfFinder() override = default;